

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * killer_xname(obj *obj_orig)

{
  byte bVar1;
  char *pcVar2;
  boolean bVar3;
  int iVar4;
  obj *obj_00;
  char *local_40;
  int osize;
  char *save_ocuname;
  char *buf;
  uint save_ocknown;
  obj *obj;
  obj *obj_orig_local;
  
  iVar4 = obj_orig->onamelth + 0x68 + (int)obj_orig->oxlth;
  obj_00 = (obj *)malloc((long)iVar4);
  memcpy(obj_00,obj_orig,(long)iVar4);
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffffffdf | 0x20;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffffffef | 0x10;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffefffff;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffffff7f;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffffffbf;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xfffffffe;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xfffffffd;
  *(uint *)&obj_00->field_0x4a = *(uint *)&obj_00->field_0x4a & 0xffff7fff;
  if (obj_00->oartifact == '\0') {
    obj_00->onamelth = '\0';
  }
  bVar1 = objects[obj_00->otyp].field_0x10;
  objects[obj_00->otyp].field_0x10 = objects[obj_00->otyp].field_0x10 & 0xfe | 1;
  pcVar2 = objects[obj_00->otyp].oc_uname;
  objects[obj_00->otyp].oc_uname = (char *)0x0;
  save_ocuname = xname(obj_00);
  if (obj_00->quan == 1) {
    bVar3 = obj_is_pname(obj_00);
    if (bVar3 == '\0') {
      local_40 = an(save_ocuname);
    }
    else {
      local_40 = the(save_ocuname);
    }
    save_ocuname = local_40;
  }
  objects[obj_00->otyp].field_0x10 = objects[obj_00->otyp].field_0x10 & 0xfe | bVar1 & 1;
  objects[obj_00->otyp].oc_uname = pcVar2;
  free(obj_00);
  return save_ocuname;
}

Assistant:

char *killer_xname(const struct obj *obj_orig)
{
    struct obj *obj;
    unsigned save_ocknown;
    char *buf, *save_ocuname;
    int osize;

    /* copy the object. */
    osize = sizeof(struct obj) + obj_orig->onamelth + obj_orig->oxlth;
    obj = malloc(osize);
    memcpy(obj, obj_orig, osize);
    
    /* killer name should be more specific than general xname; however, exact
       info like blessed/cursed and rustproof makes things be too verbose */
    obj->known = obj->dknown = 1;
    obj->bknown = obj->rknown = obj->greased = 0;
    /* if character is a priest[ess], bknown will get toggled back on */
    obj->blessed = obj->cursed = 0;
    /* "killed by poisoned <obj>" would be misleading when poison is
       not the cause of death and "poisoned by poisoned <obj>" would
       be redundant when it is, so suppress "poisoned" prefix */
    obj->opoisoned = 0;
    /* strip user-supplied name; artifacts keep theirs */
    if (!obj->oartifact) obj->onamelth = 0;
    /* temporarily identify the type of object */
    save_ocknown = objects[obj->otyp].oc_name_known;
    objects[obj->otyp].oc_name_known = 1;
    save_ocuname = objects[obj->otyp].oc_uname;
    objects[obj->otyp].oc_uname = 0;	/* avoid "foo called bar" */

    buf = xname(obj);
    if (obj->quan == 1L) buf = obj_is_pname(obj) ? the(buf) : an(buf);

    objects[obj->otyp].oc_name_known = save_ocknown;
    objects[obj->otyp].oc_uname = save_ocuname;
    
    free(obj);
    return buf;
}